

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
OneVar_LoadStructWithOneStringVariable_StringBraces_Test::
~OneVar_LoadStructWithOneStringVariable_StringBraces_Test
          (OneVar_LoadStructWithOneStringVariable_StringBraces_Test *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00174948;
  std::
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ::~unique_ptr(&(this->super_Test).gtest_flag_saver_);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OneVar, LoadStructWithOneStringVariable_StringBraces) {
	one_string_var v;
	const char* json_str = "{\n"
						   "	\"val\": \"Simple {} string\"\n"
						   "}\n";
	EXPECT_TRUE(JSON_OK == load_object_from_string(json_str, v));
	EXPECT_TRUE(v.val == "Simple {} string");
}